

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::MemoryTestInstance::MemoryTestInstance
          (MemoryTestInstance *this,Context *context,TestConfig_conflict1 *config)

{
  VkDeviceSize VVar1;
  PtrData<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  data;
  undefined4 uVar2;
  VkQueue queue_00;
  VkQueue device_00;
  VkDevice vkd_00;
  DeviceInterface *physicalDevice_00;
  ScopedLogSection SVar3;
  InstanceInterface *vk;
  VkPhysicalDevice pVVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  Context *this_00;
  ProgramCollection<vk::ProgramBinary> *binaryCollection;
  pair<unsigned_int,_vk::VkQueue_s_*> pVar8;
  deUint32 queueFamilyIndex_00;
  undefined4 in_stack_fffffffffffff11c;
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  *queues_00;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::Context> local_d21;
  PtrData<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  local_d20;
  PtrData<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  *local_d10;
  value_type local_d00;
  undefined1 local_cf0 [8];
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  queues;
  VkQueue pVStack_cd0;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vkd;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vki;
  MessageBuilder local_b28;
  string local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  string local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  ScopedLogSection local_928;
  ScopedLogSection memoryTypeSection;
  undefined1 local_918 [4];
  deUint32 memoryTypeNdx;
  MessageBuilder local_798;
  string local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  string local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  ScopedLogSection local_598;
  ScopedLogSection heapSection;
  deUint32 heapNdx;
  allocator<char> local_561;
  string local_560;
  ScopedLogSection local_540;
  ScopedLogSection section_1;
  MessageBuilder local_3b8;
  MessageBuilder local_238;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  ScopedLogSection local_68;
  ScopedLogSection section;
  TestLog *log;
  string local_50;
  TestConfig_conflict1 *local_20;
  TestConfig_conflict1 *config_local;
  Context *context_local;
  MemoryTestInstance *this_local;
  
  local_20 = config;
  config_local = (TestConfig_conflict1 *)context;
  context_local = (Context *)this;
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__MemoryTestInstance_016aa130;
  uVar2 = *(undefined4 *)&local_20->field_0x14;
  (this->m_config).sharing = local_20->sharing;
  *(undefined4 *)&(this->m_config).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)&local_20->field_0x4;
  VVar1 = local_20->size;
  (this->m_config).usage = local_20->usage;
  *(undefined4 *)&(this->m_config).field_0x4 = uVar2;
  (this->m_config).size = VVar1;
  this->m_iterationCount = 5;
  this->m_opCount = 0x32;
  vk = vkt::Context::getInstanceInterface((Context *)config_local);
  pVVar4 = vkt::Context::getPhysicalDevice((Context *)config_local);
  ::vk::getPhysicalDeviceMemoryProperties(&this->m_memoryProperties,vk,pVVar4);
  this->m_memoryTypeNdx = 0;
  this->m_iteration = 0;
  this->m_stage = (StageFunc)createCommandsAndAllocateMemory;
  *(undefined8 *)&this->field_0x258 = 0;
  pTVar5 = vkt::Context::getTestContext((Context *)config_local);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"",(allocator<char> *)((long)&log + 7));
  tcu::ResultCollector::ResultCollector(&this->m_resultCollector,pTVar6,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&log + 7));
  std::
  vector<vkt::memory::(anonymous_namespace)::Command_*,_std::allocator<vkt::memory::(anonymous_namespace)::Command_*>_>
  ::vector(&this->m_commands);
  de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>::DefaultDeleter
            ((DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory> *)((long)&log + 6));
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
  ::MovePtr(&this->m_memory,0);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  ::MovePtr(&this->m_renderContext);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::PrepareContext,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::PrepareContext>_>
  ::MovePtr(&this->m_prepareContext);
  pTVar5 = vkt::Context::getTestContext((Context *)config_local);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  section.m_log = pTVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"TestCaseInfo",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Test Case Info",&local_b1)
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_68,pTVar6,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  tcu::TestLog::operator<<(&local_238,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [14])"Buffer size: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20->size);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  tcu::TestLog::operator<<(&local_3b8,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_3b8,(char (*) [10])"Sharing: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20->sharing);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_3b8);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&section_1,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)&section_1,(char (*) [9])"Access: ");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20->usage);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&section_1);
  tcu::ScopedLogSection::~ScopedLogSection(&local_68);
  SVar3 = section;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"MemoryProperties",&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&heapNdx,"Memory Properties",
             (allocator<char> *)((long)&heapSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_540,SVar3.m_log,&local_560,(string *)&heapNdx);
  std::__cxx11::string::~string((string *)&heapNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&heapSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  for (heapSection.m_log._0_4_ = 0; SVar3.m_log = section.m_log,
      (uint)heapSection.m_log < (this->m_memoryProperties).memoryHeapCount;
      heapSection.m_log._0_4_ = (uint)heapSection.m_log + 1) {
    de::toString<unsigned_int>(&local_5d8,(uint *)&heapSection);
    std::operator+(&local_5b8,"Heap",&local_5d8);
    de::toString<unsigned_int>(&local_618,(uint *)&heapSection);
    std::operator+(&local_5f8,"Heap ",&local_618);
    tcu::ScopedLogSection::ScopedLogSection(&local_598,SVar3.m_log,&local_5b8,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5d8);
    tcu::TestLog::operator<<(&local_798,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_798,(char (*) [7])0x135969b);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,&(this->m_memoryProperties).memoryHeaps[(uint)heapSection.m_log].size
                       );
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_798);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_918,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_918,(char (*) [8])0x12f7411);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,&(this->m_memoryProperties).memoryHeaps[(uint)heapSection.m_log].
                                flags);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_918);
    tcu::ScopedLogSection::~ScopedLogSection(&local_598);
  }
  for (memoryTypeSection.m_log._4_4_ = 0; SVar3.m_log = section.m_log,
      memoryTypeSection.m_log._4_4_ < (this->m_memoryProperties).memoryTypeCount;
      memoryTypeSection.m_log._4_4_ = memoryTypeSection.m_log._4_4_ + 1) {
    de::toString<unsigned_int>(&local_968,(uint *)((long)&memoryTypeSection.m_log + 4));
    std::operator+(&local_948,"MemoryType",&local_968);
    de::toString<unsigned_int>(&local_9a8,(uint *)((long)&memoryTypeSection.m_log + 4));
    std::operator+(&local_988,"Memory type ",&local_9a8);
    tcu::ScopedLogSection::ScopedLogSection(&local_928,SVar3.m_log,&local_948,&local_988);
    std::__cxx11::string::~string((string *)&local_988);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::string::~string((string *)&local_968);
    tcu::TestLog::operator<<(&local_b28,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_b28,(char (*) [13])"Properties: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,&(this->m_memoryProperties).memoryTypes
                                [memoryTypeSection.m_log._4_4_].propertyFlags);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b28);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&vki,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)&vki,(char (*) [7])0x135970c);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,&(this->m_memoryProperties).memoryTypes
                                [memoryTypeSection.m_log._4_4_].heapIndex);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vki);
    tcu::ScopedLogSection::~ScopedLogSection(&local_928);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_540);
  physicalDevice = (VkPhysicalDevice)vkt::Context::getInstanceInterface((Context *)config_local);
  vkd = (DeviceInterface *)vkt::Context::getPhysicalDevice((Context *)config_local);
  device = (VkDevice)vkt::Context::getDeviceInterface((Context *)config_local);
  queue = (VkQueue)vkt::Context::getDevice((Context *)config_local);
  pVStack_cd0 = vkt::Context::getUniversalQueue((Context *)config_local);
  queues.
  super__Vector_base<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       vkt::Context::getUniversalQueueFamilyIndex((Context *)config_local);
  std::
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  ::vector((vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
            *)local_cf0);
  pVar8 = std::make_pair<unsigned_int_const&,vk::VkQueue_s*const&>
                    ((uint *)((long)&queues.
                                     super__Vector_base<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                     &stack0xfffffffffffff330);
  local_d00.second = pVar8.second;
  local_d00.first = pVar8.first;
  std::
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  ::push_back((vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
               *)local_cf0,&local_d00);
  this_00 = (Context *)operator_new(0x88);
  pVVar4 = physicalDevice;
  physicalDevice_00 = vkd;
  vkd_00 = device;
  device_00 = queue;
  queue_00 = pVStack_cd0;
  queueFamilyIndex_00 =
       queues.
       super__Vector_base<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  binaryCollection = vkt::Context::getBinaryCollection((Context *)config_local);
  queues_00 = (vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
               *)local_cf0;
  Context::Context(this_00,(InstanceInterface *)pVVar4,(DeviceInterface *)vkd_00,
                   (VkPhysicalDevice)physicalDevice_00,(VkDevice)device_00,queue_00,
                   queueFamilyIndex_00,queues_00,binaryCollection);
  de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>::DefaultDeleter(&local_d21);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  ::MovePtr((MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
             *)&local_d20);
  local_d10 = de::details::MovePtr::operator_cast_to_PtrData(&local_d20,(MovePtr *)this_00);
  data.ptr._4_4_ = in_stack_fffffffffffff11c;
  data.ptr._0_4_ = queueFamilyIndex_00;
  data._8_8_ = queues_00;
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  ::operator=(&this->m_renderContext,data);
  de::details::
  MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
  ::~MovePtr((MovePtr<vkt::memory::(anonymous_namespace)::Context,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Context>_>
              *)&local_d20);
  std::
  vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
  ::~vector((vector<std::pair<unsigned_int,_vk::VkQueue_s_*>,_std::allocator<std::pair<unsigned_int,_vk::VkQueue_s_*>_>_>
             *)local_cf0);
  return;
}

Assistant:

MemoryTestInstance::MemoryTestInstance (::vkt::Context& context, const TestConfig& config)
	: TestInstance			(context)
	, m_config				(config)
	, m_iterationCount		(5)
	, m_opCount				(50)
	, m_memoryProperties	(vk::getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()))
	, m_memoryTypeNdx		(0)
	, m_iteration			(0)
	, m_stage				(&MemoryTestInstance::createCommandsAndAllocateMemory)
	, m_resultCollector		(context.getTestContext().getLog())

	, m_memory				(DE_NULL)
{
	TestLog&	log	= context.getTestContext().getLog();
	{
		const tcu::ScopedLogSection section (log, "TestCaseInfo", "Test Case Info");

		log << TestLog::Message << "Buffer size: " << config.size << TestLog::EndMessage;
		log << TestLog::Message << "Sharing: " << config.sharing << TestLog::EndMessage;
		log << TestLog::Message << "Access: " << config.usage << TestLog::EndMessage;
	}

	{
		const tcu::ScopedLogSection section (log, "MemoryProperties", "Memory Properties");

		for (deUint32 heapNdx = 0; heapNdx < m_memoryProperties.memoryHeapCount; heapNdx++)
		{
			const tcu::ScopedLogSection heapSection (log, "Heap" + de::toString(heapNdx), "Heap " + de::toString(heapNdx));

			log << TestLog::Message << "Size: " << m_memoryProperties.memoryHeaps[heapNdx].size << TestLog::EndMessage;
			log << TestLog::Message << "Flags: " << m_memoryProperties.memoryHeaps[heapNdx].flags << TestLog::EndMessage;
		}

		for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < m_memoryProperties.memoryTypeCount; memoryTypeNdx++)
		{
			const tcu::ScopedLogSection memoryTypeSection (log, "MemoryType" + de::toString(memoryTypeNdx), "Memory type " + de::toString(memoryTypeNdx));

			log << TestLog::Message << "Properties: " << m_memoryProperties.memoryTypes[memoryTypeNdx].propertyFlags << TestLog::EndMessage;
			log << TestLog::Message << "Heap: " << m_memoryProperties.memoryTypes[memoryTypeNdx].heapIndex << TestLog::EndMessage;
		}
	}

	{
		const vk::InstanceInterface&			vki					= context.getInstanceInterface();
		const vk::VkPhysicalDevice				physicalDevice		= context.getPhysicalDevice();
		const vk::DeviceInterface&				vkd					= context.getDeviceInterface();
		const vk::VkDevice						device				= context.getDevice();
		const vk::VkQueue						queue				= context.getUniversalQueue();
		const deUint32							queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
		vector<pair<deUint32, vk::VkQueue> >	queues;

		queues.push_back(std::make_pair(queueFamilyIndex, queue));

		m_renderContext = MovePtr<Context>(new Context(vki, vkd, physicalDevice, device, queue, queueFamilyIndex, queues, context.getBinaryCollection()));
	}
}